

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O3

FabOnDisk *
amrex::VisMF::Write(FabOnDisk *__return_storage_ptr__,FArrayBox *fab,string *filename,ostream *os,
                   Long *bytes)

{
  pointer pcVar1;
  Long LVar2;
  long lVar3;
  
  std::ostream::seekp((long)os,_S_beg);
  LVar2 = std::ostream::tellp();
  (__return_storage_ptr__->m_name)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_name).field_2;
  pcVar1 = (filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + filename->_M_string_length);
  __return_storage_ptr__->m_head = LVar2;
  FArrayBox::writeOn(fab,os);
  std::ostream::seekp((long)os,_S_beg);
  lVar3 = std::ostream::tellp();
  *bytes = *bytes + (lVar3 - __return_storage_ptr__->m_head);
  return __return_storage_ptr__;
}

Assistant:

VisMF::FabOnDisk
VisMF::Write (const FArrayBox&   fab,
              const std::string& filename,
              std::ostream&      os,
              Long&              bytes)
{
//    BL_PROFILE("VisMF::Write_fab");
    VisMF::FabOnDisk fab_on_disk(filename, VisMF::FileOffset(os));

    fab.writeOn(os);
    //
    // Add in the number of bytes in the FAB including the FAB header.
    //
    bytes += (VisMF::FileOffset(os) - fab_on_disk.m_head);

    return fab_on_disk;
}